

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.c
# Opt level: O0

void udp_send_disc(udp_ep *ep,udp_pipe *p,udp_disc_reason reason)

{
  uint32_t seq;
  nni_aio *aio_00;
  nni_aio *aio;
  udp_disc_reason reason_local;
  udp_pipe *p_local;
  udp_ep *ep_local;
  
  if ((p->closed & 1U) == 0) {
    p->closed = true;
    while (aio_00 = (nni_aio *)nni_list_first(&p->rx_aios), aio_00 != (nni_aio *)0x0) {
      nni_aio_list_remove(aio_00);
      nni_aio_finish_error(aio_00,NNG_ECLOSED);
    }
    seq = p->self_seq;
    p->self_seq = seq + 1;
    udp_send_disc_full(ep,&p->peer_addr,p->self_id,p->peer_id,seq,reason);
  }
  return;
}

Assistant:

static void
udp_send_disc(udp_ep *ep, udp_pipe *p, udp_disc_reason reason)
{
	nni_aio *aio;
	if (p->closed) {
		return;
	}
	p->closed = true;
	while ((aio = nni_list_first(&p->rx_aios)) != NULL) {
		nni_aio_list_remove(aio);
		nni_aio_finish_error(aio, NNG_ECLOSED);
	}
	udp_send_disc_full(
	    ep, &p->peer_addr, p->self_id, p->peer_id, p->self_seq++, reason);
}